

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O3

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
Curve<3,_2>::sampleWithArcLengthParameterized
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,Curve<3,_2> *this,double *delta,bool arc_length_base,
          int *max_iter_time,vector<double,_std::allocator<double>_> *arc_length_t)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  pointer pMVar4;
  pointer pdVar5;
  double dVar6;
  pointer pdVar7;
  pointer pdVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> dists;
  double local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  vector<double,_std::allocator<double>_> local_b8;
  int local_98;
  undefined4 local_94;
  int *local_90;
  ulong local_88;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> *local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  dVar13 = *delta;
  dVar3 = this->length_;
  if ((int)CONCAT71(in_register_00000009,arc_length_base) == 0) {
    local_58 = dVar13 * dVar3;
    local_d8 = dVar13;
  }
  else {
    local_d8 = dVar13 / dVar3;
    local_58 = dVar13;
  }
  local_90 = max_iter_time;
  local_68 = arc_length_t;
  if ((local_58 < 0.0) || (dVar3 * 0.5 < local_58)) {
    __assert_fail("avg_distance >= 0 && avg_distance <= this->length_ / 2.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                  ,0x6b,
                  "virtual vector<PointType> Curve<>::sampleWithArcLengthParameterized(const double &, bool, const int &, vector<double> *) [N = 3, PointDim = 2]"
                 );
  }
  uVar12 = (uint)(dVar3 / local_58);
  local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_b8,(long)(int)uVar12,(value_type_conflict2 *)&local_80,
             (allocator_type *)&local_c8);
  local_c8 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,(long)(int)uVar12,(value_type_conflict2 *)&local_c8,
             (allocator_type *)&local_d0);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector(__return_storage_ptr__,(long)(int)(uVar12 + 1),(allocator_type *)&local_c8);
  local_d0 = 0;
  local_94 = 0;
  (*this->_vptr_Curve[2])(&local_c8,this);
  pMVar4 = (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   &(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data =
       (undefined4)local_c8;
  *(undefined4 *)
   ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array + 4) = local_c8._4_4_;
  *(undefined4 *)
   ((pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array +
   1) = uStack_c0;
  *(undefined4 *)
   ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array + 0xc) = uStack_bc;
  local_d0 = 0x3ff0000000000000;
  local_94 = 0;
  (*this->_vptr_Curve[2])(&local_c8,this);
  pMVar4 = (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar4[-1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = local_c8;
  pMVar4[-1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = (double)CONCAT44(uStack_bc,uStack_c0);
  local_88 = (ulong)uVar12;
  if (1 < (int)uVar12) {
    iVar11 = 1;
    lVar10 = 8;
    do {
      *(double *)
       ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar10) = (double)iVar11 * local_d8;
      local_d0 = local_d0 & 0xffffffff00000000;
      (*this->_vptr_Curve[2])
                (&local_c8,this,
                 (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar10,&local_d0);
      pdVar1 = (double *)
               ((long)(((__return_storage_ptr__->
                        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                      .array + lVar10 * 2);
      *pdVar1 = local_c8;
      pdVar1[1] = (double)CONCAT44(uStack_bc,uStack_c0);
      iVar11 = iVar11 + 1;
      lVar10 = lVar10 + 8;
    } while ((ulong)uVar12 * 8 - lVar10 != 0);
  }
  local_c8 = 1.0;
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_b8,
               (iterator)
               local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)&local_c8);
  }
  else {
    *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1.0;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (0 < *local_90) {
    lVar10 = (ulong)uVar12 << 3;
    dVar13 = -1.0;
    iVar11 = 0;
    while (1 < (int)local_88) {
      pMVar4 = (__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = 8;
      do {
        pdVar1 = (double *)
                 ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                        m_storage.m_data.array + lVar9 * 2);
        pdVar2 = (double *)
                 ((long)pMVar4[-1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array + lVar9 * 2);
        dVar3 = *pdVar1 - *pdVar2;
        dVar6 = pdVar1[1] - pdVar2[1];
        *(double *)
         ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9) = SQRT(dVar6 * dVar6 + dVar3 * dVar3);
        lVar9 = lVar9 + 8;
      } while (lVar10 != lVar9);
      if ((int)local_88 < 2) break;
      local_d8 = 0.0;
      lVar9 = 8;
      local_98 = iVar11;
      local_60 = dVar13;
      do {
        local_50 = *(double *)
                    ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9);
        local_d0._0_4_ = 1;
        (*this->_vptr_Curve[2])
                  (&local_c8,this,
                   (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9,&local_d0);
        local_48 = (undefined4)local_c8;
        uStack_44 = local_c8._4_4_;
        uStack_40 = uStack_c0;
        uStack_3c = uStack_bc;
        local_d0._0_4_ = 2;
        (*this->_vptr_Curve[2])
                  (&local_c8,this,
                   (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9,&local_d0);
        dVar13 = local_d8 + (local_50 - local_58);
        dVar3 = SQRT((double)CONCAT44(uStack_3c,uStack_40) * (double)CONCAT44(uStack_3c,uStack_40) +
                     (double)CONCAT44(uStack_44,local_48) * (double)CONCAT44(uStack_44,local_48));
        *(double *)
         ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9) =
             *(double *)
              ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9) -
             (dVar13 * dVar3) /
             (SQRT((double)CONCAT44(uStack_bc,uStack_c0) * (double)CONCAT44(uStack_bc,uStack_c0) +
                   local_c8 * local_c8) * dVar13 + dVar3 * dVar3);
        local_d0 = (ulong)local_d0._4_4_ << 0x20;
        (*this->_vptr_Curve[2])
                  (&local_c8,this,
                   (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9,&local_d0);
        pdVar1 = (double *)
                 ((long)(((__return_storage_ptr__->
                          super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                        m_data.array + lVar9 * 2);
        *pdVar1 = local_c8;
        pdVar1[1] = (double)CONCAT44(uStack_bc,uStack_c0);
        lVar9 = lVar9 + 8;
        local_d8 = dVar13;
      } while (lVar10 != lVar9);
      if (((dVar13 < 1e-06) || (ABS(dVar13 - local_60) < 1e-06)) ||
         (iVar11 = local_98 + 1, *local_90 <= iVar11)) break;
    }
  }
  if (local_68 != (vector<double,_std::allocator<double>_> *)0x0) {
    pdVar5 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar7 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar7;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar8;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar5;
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual auto sampleWithArcLengthParameterized(const double& delta,
                                                bool arc_length_base = true,
                                                const int& max_iter_time = 4,
                                                vector<double>* arc_length_t = nullptr)
      -> vector<PointType> {
    const double avg_distance = arc_length_base ? delta : this->length_ * delta;

    const double avg_t = arc_length_base ? avg_distance / this->length_ : delta;

    assert(avg_distance >= 0 && avg_distance <= this->length_ / 2.0);

    const int n(this->length_ / avg_distance);

    vector<double> t_array(n, 0);
    vector<double> dists(n, 0);
    vector<PointType> ret(n + 1);  // 实际上总共有 n+1 个点
    ret.front() = this->at(0.0);
    ret.back() = this->at(1.0);

    // 第一个点与最后一个点保持在开始与结尾处
    for (int i = 1; i < n; ++i) {
      t_array[i] = i * avg_t;
      ret[i] = this->at(t_array[i]);
    }
    t_array.emplace_back(1.0);

    double prev_offset = -1;

    for (int iter = 0; iter < max_iter_time; ++iter) {
      // 1. 计算上一次迭代确定的 t 参数下，每一个分段的近似长度
      for (int j = 1; j < n; j++) {
        dists[j] = (ret[j] - ret[j - 1]).norm();
      }

      double offset = 0;
      for (int j = 1; j < n; j++) {
        // 2. 累计近似弧长并计算误差
        offset += dists[j] - avg_distance;

        // 3. Newton's method
        double first_order = this->at(t_array[j], 1).norm();
        double second_order = this->at(t_array[j], 2).norm();
        double numerator = offset * first_order;
        double denominator = offset * second_order + first_order * first_order;

        t_array[j] = t_array[j] - numerator / denominator;

        ret[j] = this->at(t_array[j]);
      }

      if (offset < EPS || abs(offset - prev_offset) < EPS) {
        break;
      }
      prev_offset = offset;
    }

    if (arc_length_t != nullptr) {
      arc_length_t->swap(t_array);
    }

    return ret;
  }